

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

void cache_tag(io_buf *cache,v_array<char> tag)

{
  size_t *in_RAX;
  size_t __n;
  size_t *local_28;
  
  __n = (long)tag._end - (long)tag._begin;
  local_28 = in_RAX;
  io_buf::buf_write(cache,(char **)&local_28,__n + 8);
  *local_28 = __n;
  memcpy(local_28 + 1,tag._begin,__n);
  cache->head = (char *)((long)local_28 + __n + 8);
  return;
}

Assistant:

void cache_tag(io_buf& cache, v_array<char> tag)
{
  char* c;
  cache.buf_write(c, sizeof(size_t) + tag.size());
  *(size_t*)c = tag.size();
  c += sizeof(size_t);
  memcpy(c, tag.begin(), tag.size());
  c += tag.size();
  cache.set(c);
}